

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O1

void isobufs_store_tx_data(isobusfs_buf_log *buffer,uint8_t *data)

{
  uint uVar1;
  
  uVar1 = buffer->index;
  *(undefined8 *)buffer->entries[uVar1].data = *(undefined8 *)data;
  clock_gettime(0,(timespec *)&buffer->entries[uVar1].ts);
  buffer->index = buffer->index + ((buffer->index + 1) / 10) * -10 + 1;
  return;
}

Assistant:

void isobufs_store_tx_data(struct isobusfs_buf_log *buffer, uint8_t *data)
{
	struct isobusfs_buf *entry = &buffer->entries[buffer->index];

	/* we assume :) that data is at least 8 bytes long */
	memcpy(entry->data, data, sizeof(entry->data));
	clock_gettime(CLOCK_REALTIME, &entry->ts);

	buffer->index = (buffer->index + 1) % ISOBUSFS_MAX_BUF_ENTRIES;
}